

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O1

int __thiscall CNetServer::Recv(CNetServer *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  NETADDR *pNVar1;
  CNetRecvUnpacker *this_00;
  CNetPacketConstruct *pPacket;
  uchar *puVar2;
  uchar uVar3;
  undefined8 uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  TOKEN TVar11;
  char *str;
  bool bVar12;
  ulong uVar13;
  NETADDR *a;
  long lVar14;
  uint uVar15;
  NETADDR *b;
  CNetConnection *this_01;
  long in_FS_OFFSET;
  int LastInfoQuery;
  char FullMsg [20];
  char aBuf [128];
  NETADDR_conflict Addr;
  int local_15c;
  char local_158 [8];
  char acStack_150 [8];
  undefined4 local_148;
  char local_d8 [136];
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_RecvUnpacker;
  pPacket = &(this->m_RecvUnpacker).m_Data;
  pNVar1 = &pChunk->m_Address;
  puVar2 = (this->m_RecvUnpacker).m_Data.m_aChunkData;
  this_01 = &this->m_aSlots[0].m_Connection;
  b = (NETADDR *)&this->m_aSlots[0].m_Connection.m_PeerAddr;
  if ((this_00->m_Valid == true) &&
     (iVar9 = CNetRecvUnpacker::FetchChunk(this_00,pChunk), iVar9 != 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return 1;
  }
  iVar9 = CNetBase::UnpackPacket
                    (&this->super_CNetBase,&local_50,(this->m_RecvUnpacker).m_aBuffer,pPacket);
  uVar15 = 3;
  if (0 < iVar9) goto LAB_0013d0b2;
  if (iVar9 == 0) {
    if ((this->m_pNetBan == (CNetBan *)0x0) ||
       (bVar8 = CNetBan::IsBanned(this->m_pNetBan,(NETADDR_conflict *)&local_50,local_d8,0x80,
                                  &local_15c), !bVar8)) {
      uVar13 = 0;
      bVar8 = false;
      bVar12 = false;
      a = b;
      do {
        if ((*(int *)(a[-0x59f].ip + 4) != 0) && (iVar9 = net_addr_comp(a,&local_50,1), iVar9 == 0))
        {
          iVar9 = CNetConnection::Feed
                            ((CNetConnection *)(a + -0x59f),pPacket,(NETADDR_conflict *)&local_50);
          if ((iVar9 == 0) || ((this->m_RecvUnpacker).m_Data.m_DataSize == 0)) {
            bVar12 = true;
          }
          else {
            if (((this->m_RecvUnpacker).m_Data.m_Flags & 8) != 0) {
              pChunk->m_Flags = 2;
              *(undefined8 *)((pChunk->m_Address).ip + 0xc) = *(undefined8 *)(a->ip + 0xc);
              uVar3 = a->ip[0];
              uVar5 = a->ip[1];
              uVar6 = a->ip[2];
              uVar7 = a->ip[3];
              uVar4 = *(undefined8 *)(a->ip + 4);
              pNVar1->type = a->type;
              pNVar1->ip[0] = uVar3;
              pNVar1->ip[1] = uVar5;
              pNVar1->ip[2] = uVar6;
              pNVar1->ip[3] = uVar7;
              *(undefined8 *)((pChunk->m_Address).ip + 4) = uVar4;
              pChunk->m_ClientID = (int)uVar13;
              pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
              pChunk->m_pData = puVar2;
              uVar15 = 1;
              if (pResponseToken != (TOKEN *)0x0) {
                *pResponseToken = 0xffffffff;
              }
              goto LAB_0013cebf;
            }
            CNetRecvUnpacker::Start(this_00,&local_50,(CNetConnection *)(a + -0x59f),(int)uVar13);
            bVar12 = true;
          }
        }
        bVar8 = 0x3e < uVar13;
        uVar13 = uVar13 + 1;
        a = a + 0x5a1;
      } while (uVar13 != 0x40);
      uVar15 = 4;
LAB_0013cebf:
      if (((bVar8) && (uVar15 = 2, !bVar12)) &&
         (iVar9 = CNetTokenManager::ProcessMessage(&this->m_TokenManager,&local_50,pPacket),
         0 < iVar9)) {
        uVar15 = (this->m_RecvUnpacker).m_Data.m_Flags;
        if ((uVar15 & 1) == 0) {
          if ((uVar15 & 8) != 0) {
            pChunk->m_Flags = 2;
            pChunk->m_ClientID = -1;
            *(undefined8 *)((pChunk->m_Address).ip + 0xc) = local_50._16_8_;
            pNVar1->type = local_50.type;
            pNVar1->ip[0] = local_50.ip[0];
            pNVar1->ip[1] = local_50.ip[1];
            pNVar1->ip[2] = local_50.ip[2];
            pNVar1->ip[3] = local_50.ip[3];
            *(undefined8 *)((pChunk->m_Address).ip + 4) = local_50.ip._4_8_;
            pChunk->m_DataSize = (this->m_RecvUnpacker).m_Data.m_DataSize;
            pChunk->m_pData = puVar2;
            uVar15 = 1;
            if (pResponseToken != (TOKEN *)0x0) {
              *pResponseToken = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
            }
            goto LAB_0013d0a4;
          }
        }
        else {
          uVar3 = (this->m_RecvUnpacker).m_Data.m_aChunkData[0];
          if (uVar3 == '\x05') {
            CNetTokenCache::AddToken
                      (&this->m_TokenCache,&local_50,(this->m_RecvUnpacker).m_Data.m_ResponseToken,2
                      );
          }
          else if (uVar3 == '\x01') {
            if (this->m_MaxClients <= this->m_NumClients) {
              local_158[0] = 'T';
              local_158[1] = 'h';
              local_158[2] = 'i';
              local_158[3] = 's';
              local_158[4] = ' ';
              local_158[5] = 's';
              local_158[6] = 'e';
              local_158[7] = 'r';
              acStack_150[0] = 'v';
              acStack_150[1] = 'e';
              acStack_150[2] = 'r';
              acStack_150[3] = ' ';
              acStack_150[4] = 'i';
              acStack_150[5] = 's';
              acStack_150[6] = ' ';
              acStack_150[7] = 'f';
              local_148 = 0x6c6c75;
              TVar11 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
              iVar9 = 0x14;
              str = local_158;
              goto LAB_0013ce02;
            }
            iVar9 = 1;
            uVar13 = 0;
            bVar8 = false;
            do {
              if ((*(int *)(b[-0x59f].ip + 4) != 0) &&
                 (iVar10 = net_addr_comp(&local_50,b,0), iVar10 == 0)) {
                if (this->m_MaxClientsPerIP <= iVar9) {
                  str_format(local_158,0x80,"Only %d players with the same IP are allowed");
                  TVar11 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
                  iVar9 = str_length(local_158);
                  CNetBase::SendControlMsg
                            (&this->super_CNetBase,&local_50,TVar11,0,4,local_158,iVar9 + 1);
                  uVar15 = 2;
                  goto LAB_0013d14e;
                }
                iVar9 = iVar9 + 1;
              }
              bVar8 = 0x3e < uVar13;
              uVar13 = uVar13 + 1;
              b = b + 0x5a1;
            } while (uVar13 != 0x40);
            lVar14 = 0;
            do {
              if (this_01->m_State == 0) {
                this->m_NumClients = this->m_NumClients + 1;
                CNetConnection::SetToken(this_01,(this->m_RecvUnpacker).m_Data.m_Token);
                CNetConnection::Feed(this_01,pPacket,(NETADDR_conflict *)&local_50);
                if (this->m_pfnNewClient != (NETFUNC_NEWCLIENT)0x0) {
                  (*this->m_pfnNewClient)((int)lVar14,this->m_UserPtr);
                }
                break;
              }
              lVar14 = lVar14 + 1;
              this_01 = this_01 + 1;
            } while (lVar14 != 0x40);
            uVar15 = 0;
LAB_0013d14e:
            if (!bVar8) goto LAB_0013d0a4;
          }
        }
        uVar15 = 0;
      }
    }
    else {
      iVar9 = time_timestamp();
      uVar15 = 2;
      if (local_15c + 5 < iVar9) {
        TVar11 = (this->m_RecvUnpacker).m_Data.m_ResponseToken;
        str = local_d8;
        iVar9 = str_length(str);
        iVar9 = iVar9 + 1;
LAB_0013ce02:
        uVar15 = 2;
        CNetBase::SendControlMsg(&this->super_CNetBase,&local_50,TVar11,0,4,str,iVar9);
      }
    }
LAB_0013d0a4:
    if (uVar15 != 0) goto LAB_0013d0b2;
  }
  uVar15 = 0;
LAB_0013d0b2:
  iVar9 = (*(code *)((long)&DAT_0015068c + (long)(int)(&DAT_0015068c)[uVar15]))();
  return iVar9;
}

Assistant:

int CNetServer::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.IsActive() && m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			// check for bans
			char aBuf[128];
			int LastInfoQuery;
			if(NetBan() && NetBan()->IsBanned(&Addr, aBuf, sizeof(aBuf), &LastInfoQuery))
			{
				// banned, reply with a message (5 second cooldown)
				int Time = time_timestamp();
				if(LastInfoQuery + 5 < Time)
				{
					SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
				}
				continue;
			}

			bool Found = false;
			// try to find matching slot
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(m_aSlots[i].m_Connection.PeerAddress(), &Addr, true) == 0)
				{
					if(m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
					{
						if(m_RecvUnpacker.m_Data.m_DataSize)
						{
							if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
								m_RecvUnpacker.Start(&Addr, &m_aSlots[i].m_Connection, i);
							else
							{
								pChunk->m_Flags = NETSENDFLAG_CONNLESS;
								pChunk->m_Address = *m_aSlots[i].m_Connection.PeerAddress();
								pChunk->m_ClientID = i;
								pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
								pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
								if(pResponseToken)
									*pResponseToken = NET_TOKEN_NONE;
								return 1;
							}
						}
					}
					Found = true;
				}
			}

			if(Found)
				continue;

			int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
			if(Accept <= 0)
				continue;

			if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
			{
				if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_CONNECT)
				{
					// check if there are free slots
					if(m_NumClients >= m_MaxClients)
					{
						const char FullMsg[] = "This server is full";
						SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, FullMsg, sizeof(FullMsg));
						continue;
					}

					// only allow a specific number of players with the same ip
					int FoundAddr = 1;
					
					bool Continue = false;
					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
							continue;

						if(!net_addr_comp(&Addr, m_aSlots[i].m_Connection.PeerAddress(), false))
						{
							if(FoundAddr++ >= m_MaxClientsPerIP)
							{
								char aBuf[128];
								str_format(aBuf, sizeof(aBuf), "Only %d players with the same IP are allowed", m_MaxClientsPerIP);
								SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
								Continue = true;
								break;
							}
						}
					}

					if(Continue)
						continue;

					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
						{
							m_NumClients++;
							m_aSlots[i].m_Connection.SetToken(m_RecvUnpacker.m_Data.m_Token);
							m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr);
							if(m_pfnNewClient)
								m_pfnNewClient(i, m_UserPtr);
							break;
						}
					}
				}
				else if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
					m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_RESPONSEONLY);
			}
			else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS)
			{
				pChunk->m_Flags = NETSENDFLAG_CONNLESS;
				pChunk->m_ClientID = -1;
				pChunk->m_Address = Addr;
				pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
				pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
				if(pResponseToken)
					*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
				return 1;
			}
		}
	}
	return 0;
}